

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_setup.cpp
# Opt level: O2

void P_LoadLineDefs(MapData *map)

{
  byte *pbVar1;
  double *pdVar2;
  double dVar3;
  ushort uVar4;
  ushort uVar5;
  FileReader *pFVar6;
  undefined1 auVar7 [16];
  DWORD DVar8;
  int iVar9;
  int iVar10;
  maplinedef_t *buffer;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  maplinedef_t *pmVar14;
  uint uVar15;
  line_t_conflict *ld;
  
  pFVar6 = map->MapLumps[2].Reader;
  if (pFVar6 == (FileReader *)0x0) {
    uVar11 = 0;
  }
  else {
    uVar11 = (ulong)(int)pFVar6->Length;
  }
  uVar13 = (uint)(uVar11 / 0xe);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = (long)(int)uVar13;
  uVar12 = 0xffffffffffffffff;
  if (SUB168(auVar7 * ZEXT816(0x98),8) == 0) {
    uVar12 = SUB168(auVar7 * ZEXT816(0x98),0);
  }
  numlines = uVar13;
  lines = (line_t_conflict *)operator_new__(uVar12);
  TArray<int,_int>::Resize(&linemap,uVar13);
  memset(lines,0,(long)numlines * 0x98);
  buffer = (maplinedef_t *)operator_new__(uVar11);
  MapData::Read(map,2,buffer,-1);
  sidecount = 0;
  iVar10 = 0;
  uVar13 = 0;
  do {
    while( true ) {
      pmVar14 = buffer + (int)uVar13;
      uVar15 = iVar10 + uVar13;
      while( true ) {
        if (numlines <= (int)uVar13) {
          P_AllocateSideDefs(sidecount);
          pmVar14 = buffer;
          ld = lines;
          for (iVar10 = 0; iVar10 < numlines; iVar10 = iVar10 + 1) {
            ld->alpha = 1.0;
            ld->portalindex = 0xffffffff;
            P_TranslateLineDef((line_t *)ld,pmVar14,-1);
            if ((((ld->special == 0xbe) && (ld->args[1] - 0xfdU < 2)) ||
                (FTagManager::AddLineID(&tagManager,iVar10,(int)pmVar14->tag), ld->special == 0xbe))
               && (ld->args[1] == 0xfe)) {
              ProcessEDLinedef(ld,(int)pmVar14->tag);
            }
            ld->v1 = vertexes + pmVar14->v1;
            ld->v2 = vertexes + pmVar14->v2;
            P_SetSideNum(ld->sidedef,pmVar14->sidenum[0]);
            P_SetSideNum(ld->sidedef + 1,pmVar14->sidenum[1]);
            P_AdjustLine(ld);
            P_SaveLineSpecial(ld);
            DVar8 = level.flags2;
            if ((level.flags2 >> 9 & 1) != 0) {
              pbVar1 = (byte *)((long)&ld->flags + 2);
              *pbVar1 = *pbVar1 | 8;
            }
            if ((DVar8 >> 10 & 1) != 0) {
              pbVar1 = (byte *)((long)&ld->flags + 2);
              *pbVar1 = *pbVar1 | 0x10;
            }
            if ((DVar8 >> 0xb & 1) != 0) {
              pbVar1 = (byte *)((long)&ld->flags + 2);
              *pbVar1 = *pbVar1 | 0x40;
            }
            pmVar14 = pmVar14 + 1;
            ld = ld + 1;
          }
          operator_delete__(buffer);
          return;
        }
        uVar4 = pmVar14->v1;
        uVar5 = pmVar14->v2;
        if ((int)(uint)uVar4 < numvertexes && (int)(uint)uVar5 < numvertexes) break;
        operator_delete__(buffer);
        I_Error("Line %d has invalid vertices: %d and/or %d.\nThe map only contains %d vertices.",
                (ulong)uVar15,(ulong)uVar4,(ulong)uVar5,(ulong)(uint)numvertexes);
      }
      if (uVar4 != uVar5) break;
LAB_00447542:
      Printf("Removing 0-length line %d\n",(ulong)uVar15);
      iVar9 = numlines;
      memmove(pmVar14,pmVar14 + 1,(long)(int)(~uVar13 + numlines) * 0xe);
      ForceNodeBuild = true;
      iVar10 = iVar10 + 1;
      numlines = iVar9 + -1;
    }
    dVar3 = vertexes[uVar4].p.X;
    if ((dVar3 == vertexes[uVar5].p.X) && (!NAN(dVar3) && !NAN(vertexes[uVar5].p.X))) {
      dVar3 = vertexes[uVar4].p.Y;
      pdVar2 = &vertexes[uVar5].p.Y;
      if ((dVar3 == *pdVar2) && (!NAN(dVar3) && !NAN(*pdVar2))) goto LAB_00447542;
    }
    if (pmVar14->sidenum[0] == 0xffff) {
      Printf("Line %d has no first side.\n",(ulong)uVar13);
      pmVar14->sidenum[0] = 0;
    }
    iVar9 = sidecount + 1;
    if (pmVar14->sidenum[1] != 0xffff) {
      iVar9 = sidecount + 2;
    }
    sidecount = iVar9;
    linemap.Array[(int)uVar13] = uVar15;
    uVar13 = uVar13 + 1;
  } while( true );
}

Assistant:

void P_LoadLineDefs (MapData * map)
{
	int i, skipped;
	line_t *ld;
	int lumplen = map->Size(ML_LINEDEFS);
	char * mldf;
	maplinedef_t *mld;
		
	numlines = lumplen / sizeof(maplinedef_t);
	lines = new line_t[numlines];
	linemap.Resize(numlines);
	memset (lines, 0, numlines*sizeof(line_t));

	mldf = new char[lumplen];
	map->Read(ML_LINEDEFS, mldf);

	// [RH] Count the number of sidedef references. This is the number of
	// sidedefs we need. The actual number in the SIDEDEFS lump might be less.
	// Lines with 0 length are also removed.

	for (skipped = sidecount = i = 0; i < numlines; )
	{
		mld = ((maplinedef_t*)mldf) + i;
		int v1 = LittleShort(mld->v1);
		int v2 = LittleShort(mld->v2);

		if (v1 >= numvertexes || v2 >= numvertexes)
		{
			delete [] mldf;
			I_Error ("Line %d has invalid vertices: %d and/or %d.\nThe map only contains %d vertices.", i+skipped, v1, v2, numvertexes);
		}
		else if (v1 == v2 ||
			(vertexes[LittleShort(mld->v1)].fX() == vertexes[LittleShort(mld->v2)].fX() &&
			 vertexes[LittleShort(mld->v1)].fY() == vertexes[LittleShort(mld->v2)].fY()))
		{
			Printf ("Removing 0-length line %d\n", i+skipped);
			memmove (mld, mld+1, sizeof(*mld)*(numlines-i-1));
			ForceNodeBuild = true;
			skipped++;
			numlines--;
		}
		else
		{
			// patch missing first sides instead of crashing out.
			// Visual glitches are better than not being able to play.
			if (LittleShort(mld->sidenum[0]) == NO_INDEX)
			{
				Printf("Line %d has no first side.\n", i);
				mld->sidenum[0] = 0;
			}
			sidecount++;
			if (LittleShort(mld->sidenum[1]) != NO_INDEX)
				sidecount++;
			linemap[i] = i+skipped;
			i++;
		}
	}

	P_AllocateSideDefs (sidecount);

	mld = (maplinedef_t *)mldf;
	ld = lines;
	for (i = 0; i < numlines; i++, mld++, ld++)
	{
		ld->alpha = 1.;	// [RH] Opaque by default
		ld->portalindex = UINT_MAX;

		// [RH] Translate old linedef special and flags to be
		//		compatible with the new format.

		P_TranslateLineDef (ld, mld, -1);
		// do not assign the tag for Extradata lines.
		if (ld->special != Static_Init || (ld->args[1] != Init_EDLine && ld->args[1] != Init_EDSector))
		{
			tagManager.AddLineID(i, mld->tag);
		}
#ifndef NO_EDATA
		if (ld->special == Static_Init && ld->args[1] == Init_EDLine)
		{
			ProcessEDLinedef(ld, mld->tag);
		}
#endif

		ld->v1 = &vertexes[LittleShort(mld->v1)];
		ld->v2 = &vertexes[LittleShort(mld->v2)];

		P_SetSideNum (&ld->sidedef[0], LittleShort(mld->sidenum[0]));
		P_SetSideNum (&ld->sidedef[1], LittleShort(mld->sidenum[1]));

		P_AdjustLine (ld);
		P_SaveLineSpecial (ld);
		if (level.flags2 & LEVEL2_CLIPMIDTEX) ld->flags |= ML_CLIP_MIDTEX;
		if (level.flags2 & LEVEL2_WRAPMIDTEX) ld->flags |= ML_WRAP_MIDTEX;
		if (level.flags2 & LEVEL2_CHECKSWITCHRANGE) ld->flags |= ML_CHECKSWITCHRANGE;
	}
	delete[] mldf;
}